

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::removeBaseWidget(QMdiSubWindowPrivate *this)

{
  QPointer<QWidget> *this_00;
  QWidget *this_01;
  QLayout *this_02;
  Data *pDVar1;
  bool bVar2;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->baseWidget;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    QObject::removeEventFilter((this->baseWidget).wp.value);
    this_02 = (this->super_QWidgetPrivate).layout;
    if (this_02 != (QLayout *)0x0) {
      pDVar1 = (this_00->wp).d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QWidget *)0x0;
      }
      else {
        pQVar3 = (QWidget *)(this->baseWidget).wp.value;
      }
      QLayout::removeWidget(this_02,pQVar3);
    }
    QWidget::windowTitle((QString *)&local_58,(QWidget *)(this->baseWidget).wp.value);
    QWidget::windowTitle((QString *)&local_70,this_01);
    bVar2 = ::comparesEqual((QString *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (bVar2) {
      this->ignoreWindowTitleChange = true;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_58.size = 0;
      QWidget::setWindowTitle(this_01,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      this->ignoreWindowTitleChange = false;
      QWidget::setWindowModified(this_01,false);
    }
    QString::clear(&this->lastChildWindowTitle);
    if (((this->baseWidget).wp.d != (Data *)0x0) &&
       (pQVar3 = (QWidget *)(this->baseWidget).wp.value,
       *(QWidget **)(*(long *)&pQVar3->field_0x8 + 0x10) == this_01)) {
      QWidget::setParent(pQVar3,(QWidget *)0x0);
    }
    QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)0x0);
    this->isWidgetHiddenByUs = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::removeBaseWidget()
{
    if (!baseWidget)
        return;

    Q_Q(QMdiSubWindow);
    baseWidget->removeEventFilter(q);
    if (layout)
        layout->removeWidget(baseWidget);
    if (baseWidget->windowTitle() == q->windowTitle()) {
        ignoreWindowTitleChange = true;
        q->setWindowTitle(QString());
        ignoreWindowTitleChange = false;
        q->setWindowModified(false);
    }
    lastChildWindowTitle.clear();
    // QTBUG-47993: parent widget can be reset before this call
    if (baseWidget->parentWidget() == q)
        baseWidget->setParent(nullptr);
    baseWidget = nullptr;
    isWidgetHiddenByUs = false;
}